

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
  *this;
  ostream *poVar1;
  allocator<char> local_1d1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> line;
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  Cmd cmd;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&line,"history.txt",&local_1d1);
  Cmd::Cmd(&cmd,(string *)&line,_stdin,_stdout);
  std::__cxx11::string::~string((string *)&line);
  cmd.multiline_mode = true;
  local_148._M_unused._M_object = (void *)0x0;
  local_148._8_8_ = 0;
  local_130 = std::
              _Function_handler<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/eteran[P]cpp-cmd/main.cpp:13:23)>
              ::_M_invoke;
  local_138 = std::
              _Function_handler<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/eteran[P]cpp-cmd/main.cpp:13:23)>
              ::_M_manager;
  std::function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>::
  operator=(&cmd.hints_handler_,
            (function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
             *)&local_148);
  std::_Function_base::~_Function_base((_Function_base *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>((string *)&line,"test",&local_1d1);
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_150 = std::
              _Function_handler<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/eteran[P]cpp-cmd/main.cpp:24:30)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/eteran[P]cpp-cmd/main.cpp:24:30)>
              ::_M_manager;
  this = &cmd.commands_;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>>
  ::
  _M_emplace_unique<std::__cxx11::string_const&,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>>
              *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
             (function<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_168);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::string<std::allocator<char>>((string *)&line,"clear",&local_1d1);
  local_188._M_unused._M_object = (void *)0x0;
  local_188._8_8_ = 0;
  local_170 = std::
              _Function_handler<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/eteran[P]cpp-cmd/main.cpp:33:31)>
              ::_M_invoke;
  local_178 = std::
              _Function_handler<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/eteran[P]cpp-cmd/main.cpp:33:31)>
              ::_M_manager;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>>
  ::
  _M_emplace_unique<std::__cxx11::string_const&,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>>
              *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
             (function<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_188);
  std::_Function_base::~_Function_base((_Function_base *)&local_188);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::string<std::allocator<char>>((string *)&line,"exit",&local_1d1);
  local_1a8._M_unused._M_object = (void *)0x0;
  local_1a8._8_8_ = 0;
  local_190 = std::
              _Function_handler<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/eteran[P]cpp-cmd/main.cpp:39:30)>
              ::_M_invoke;
  local_198 = std::
              _Function_handler<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/eteran[P]cpp-cmd/main.cpp:39:30)>
              ::_M_manager;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>>
  ::
  _M_emplace_unique<std::__cxx11::string_const&,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>>
              *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
             (function<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_1a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::assign((char *)&cmd);
  Cmd::nextLine_abi_cxx11_(&line,&cmd,true);
  if (line.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&line);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&line);
  std::__cxx11::string::assign((char *)&cmd);
  Cmd::cmdLoop(&cmd);
  Cmd::~Cmd(&cmd);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

	(void)argc;
	(void)argv;

	Cmd cmd("history.txt");
	cmd.multiline_mode = true;

	cmd.setHintsCallback([](std::string_view buf) -> std::optional<Cmd::Hint> {
		if (buf == "git remote add") {
			Cmd::Hint r;
			r.hint_string = " <name> <url>";
			r.color = 90;
			r.bold = false;
			return r;
		}
		return {};
	});

	cmd.registerCommand("test", [](Cmd *cmd, const std::vector<std::string> &argv) {
		(void)cmd;
		printf("Hello World!\n");
		for(size_t i = 1; i < argv.size(); ++i) {
			printf("\t%s\n", argv[i].c_str());
		}
		return false;
	});

	cmd.registerCommand("clear", [](Cmd *cmd, const std::vector<std::string> &argv) {
		(void)argv;
		cmd->clearScreen();
		return false;
	});

	cmd.registerCommand("exit", [](Cmd *cmd, const std::vector<std::string> &argv) {
		(void)cmd;
		(void)argv;
		return true;
	});

	cmd.prompt = "(Password) ";

	if (auto line = cmd.nextLine(true)) {
		std::cout << *line << std::endl;
	}

	cmd.prompt = "(Cmd) ";

	cmd.cmdLoop();
}